

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O2

char * prev_path_ele(char *start,char *p,size_t *ele_len)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  
  if (p == start) {
    return (char *)0x0;
  }
  iVar3 = 0;
  pcVar2 = (char *)0x0;
LAB_00107416:
  while (p != start) {
    uVar4 = ~(ulong)p;
    do {
      pcVar5 = p;
      if (pcVar5 == start) {
        sVar6 = 0;
        p = start;
        goto LAB_0010749c;
      }
      uVar4 = uVar4 + 1;
      p = pcVar5 + -1;
    } while (pcVar5[-1] == '/');
    do {
      p = start;
      if (pcVar5 == start) break;
      pcVar1 = pcVar5 + -1;
      p = pcVar5;
      pcVar5 = pcVar5 + -1;
    } while (*pcVar1 != '/');
    pcVar5 = p + uVar4;
    sVar6 = -(long)pcVar5;
    if (pcVar5 == (char *)0xffffffffffffffff) goto code_r0x00107464;
    if (((pcVar5 != (char *)0xfffffffffffffffe) || (*p != '.')) || (p[1] != '.')) goto LAB_00107488;
    iVar3 = iVar3 + 1;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = p;
    }
  }
  sVar6 = (size_t)((uint)(pcVar2 != (char *)0x0) * 2);
  p = pcVar2;
LAB_0010749c:
  *ele_len = sVar6;
  return p;
code_r0x00107464:
  if (*p != '.') {
LAB_00107488:
    if (iVar3 == 0) goto LAB_0010749c;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      pcVar2 = (char *)0x0;
    }
  }
  goto LAB_00107416;
}

Assistant:

static const char *prev_path_ele(const char *start, const char *p,
                                 size_t *ele_len)
{
    int cancel = 0;
    const char *dotdot = 0;

    /* if we're at the start of the string, there are no more elements */
    if (p == start)
        return 0;

    /* keep going until we find a suitable element */
    for (;;)
    {
        const char *endp;

        /*
         *   If we've reached the start of the string, it means that we have
         *   ".."'s that canceled out every earlier element of the string.
         *   If the cancel count is non-zero, it means that we have one or
         *   more ".."'s that are significant (in that they cancel out
         *   relative elements before the start of the string).  If the
         *   cancel count is zero, it means that we've exactly canceled out
         *   all remaining elements in the string.
         */
        if (p == start)
        {
            *ele_len = (dotdot != 0 ? 2 : 0);
            return dotdot;
        }
        
        /* 
         *   back up through any adjacent path separators before the current
         *   element, so that we're pointing to the first separator after the
         *   previous element
         */
        for ( ; p != start && ispathchar(*(p-1)) ; --p) ;

        /*
         *   If we're at the start of the string, this is an absolute path.
         *   Treat it specially by returning a zero-length initial element. 
         */
        if (p == start)
        {
            *ele_len = 0;
            return p;
        }

        /* note where the current element ends */
        endp = p;

        /* now back up to the path separator before this element */
        for ( ; p != start && !ispathchar(*(p-1)) ; --p) ;

        /* 
         *   if this is ".", skip it, since this simply means that this
         *   element matches the same folder as the previous element 
         */
        if (endp - p == 1 && p[0] == '.')
            continue;

        /* 
         *   if this is "..", it cancels out the preceding non-relative
         *   element; up the cancel count and keep searching 
         */
        if (endp - p == 2 && p[0] == '.' && p[1] == '.')
        {
            /* up the cancel count */
            ++cancel;

            /* if this is the first ".." we've encountered, note it */
            if (dotdot == 0)
                dotdot = p;

            /* keep searching */
            continue;
        }

        /*
         *   This is an ordinary path element, not a relative "." or ".."
         *   link.  If we have a non-zero cancel count, we're still working
         *   on canceling out elements from ".."'s we found later in the
         *   string.
         */
        if (cancel != 0)
        {
            /* this absorbs one level of cancellation */
            --cancel;

            /* 
             *   if that's the last cancellation, we've absorbed all ".."
             *   effects, so the last ".." we found is no longer significant 
             */
            if (cancel == 0)
                dotdot = 0;

            /* keep searching */
            continue;
        }

        /* this item isn't canceled out by a "..", so it's our winner */
        *ele_len = endp - p;
        return p;
    }
}